

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZ77.h
# Opt level: O0

void __thiscall Lz77Encoder::Lz77Encoder(Lz77Encoder *this,string *message)

{
  string local_38;
  string *local_18;
  string *message_local;
  Lz77Encoder *this_local;
  
  local_18 = message;
  message_local = (string *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)message);
  Cryptor::Cryptor(&this->super_Cryptor,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_Cryptor)._vptr_Cryptor = (_func_int **)&PTR__Lz77Encoder_00121cf0;
  Cryptor::set_show(&this->super_Cryptor,true);
  return;
}

Assistant:

explicit Lz77Encoder(const std::string &message) : Cryptor(message) {set_show(true);}